

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int * Gia_ManHashFind(Gia_Man_t *p,int iLit0,int iLit1,int iLitC)

{
  uint *puVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint *puVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  if ((-1 < iLit0) && (-1 < iLit1)) {
    iVar5 = ((uint)iLit0 >> 1) * 0x1f01;
    iVar8 = ((uint)iLit1 >> 1) * 0xb9b;
    iVar9 = iVar5 + 0x38f;
    if ((iLit0 & 1U) == 0) {
      iVar9 = iVar5;
    }
    iVar5 = iVar8 + 0x161;
    if ((iLit1 & 1U) == 0) {
      iVar5 = iVar8;
    }
    puVar1 = p->pMuxes;
    if (iLit1 <= iLit0 && puVar1 == (uint *)0x0) {
      __assert_fail("p->pMuxes || iLit0 < iLit1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                    ,0x3a,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
    }
    if ((iLit1 <= iLit0) && (((iLit1 | iLit0) & 1U) != 0)) {
      __assert_fail("iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                    ,0x3b,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
    }
    if ((iLit1 & 1U) != 0 && iLitC != -1) {
      __assert_fail("iLitC == -1 || !Abc_LitIsCompl(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                    ,0x3c,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
    }
    puVar4 = (uint *)(p->pHTable + (int)((uint)(iVar5 + iVar9 + iLitC * 0x7db) % (uint)p->nHTable));
    uVar10 = *puVar4;
    if (uVar10 == 0) {
      pGVar6 = (Gia_Obj_t *)0x0;
    }
    else {
      if ((int)uVar10 < 0) goto LAB_006b14b0;
      if (p->nObjs <= (int)(uVar10 >> 1)) {
LAB_006b14cf:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = p->pObjs + (uVar10 >> 1);
    }
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      pGVar2 = p->pObjs;
      do {
        if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar5 = (int)((long)pGVar6 - (long)pGVar2 >> 2) * -0x55555555;
        uVar3 = *(ulong *)pGVar6;
        iVar9 = iVar5 - ((uint)uVar3 & 0x1fffffff);
        if (iVar9 < 0) {
LAB_006b1491:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        if (((uint)(uVar3 >> 0x1d) & 1) + iVar9 * 2 == iLit0) {
          uVar10 = (uint)(uVar3 >> 0x20);
          iVar9 = iVar5 - (uVar10 & 0x1fffffff);
          if (iVar9 < 0) goto LAB_006b1491;
          if ((uVar10 >> 0x1d & 1) + iVar9 * 2 == iLit1) {
            if (puVar1 == (uint *)0x0) {
              return (int *)puVar4;
            }
            if ((-(uint)(puVar1[iVar5] == 0) | puVar1[iVar5]) == iLitC) {
              return (int *)puVar4;
            }
          }
        }
        uVar10 = pGVar6->Value;
        if (uVar10 == 0) {
          pGVar7 = (Gia_Obj_t *)0x0;
        }
        else {
          if ((int)uVar10 < 0) goto LAB_006b14b0;
          if (p->nObjs <= (int)(uVar10 >> 1)) goto LAB_006b14cf;
          pGVar7 = pGVar2 + (uVar10 >> 1);
        }
        puVar4 = &pGVar6->Value;
        pGVar6 = pGVar7;
      } while (pGVar7 != (Gia_Obj_t *)0x0);
    }
    return (int *)puVar4;
  }
LAB_006b14b0:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10c,"int Abc_Lit2Var(int)");
}

Assistant:

static inline int * Gia_ManHashFind( Gia_Man_t * p, int iLit0, int iLit1, int iLitC )
{
    Gia_Obj_t * pThis;
    int * pPlace = p->pHTable + Gia_ManHashOne( iLit0, iLit1, iLitC, p->nHTable );
    assert( p->pMuxes || iLit0 < iLit1 );
    assert( iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)) );
    assert( iLitC == -1 || !Abc_LitIsCompl(iLit1) );
    for ( pThis = (*pPlace)? Gia_ManObj(p, Abc_Lit2Var(*pPlace)) : NULL; pThis; 
          pPlace = (int *)&pThis->Value, pThis = (*pPlace)? Gia_ManObj(p, Abc_Lit2Var(*pPlace)) : NULL )
              if ( Gia_ObjFaninLit0p(p, pThis) == iLit0 && Gia_ObjFaninLit1p(p, pThis) == iLit1 && (p->pMuxes == NULL || Gia_ObjFaninLit2p(p, pThis) == iLitC) )
                  break;
    return pPlace;
}